

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

int __thiscall
sqvector<long_long>::copy(sqvector<long_long> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong local_28;
  SQUnsignedInteger i;
  EVP_PKEY_CTX *local_18;
  sqvector<long_long> *v_local;
  sqvector<long_long> *this_local;
  
  local_18 = dst;
  v_local = this;
  if (this->_size != 0) {
    i = 0;
    resize(this,0,(longlong *)&i);
  }
  if (this->_allocated < *(ulong *)(local_18 + 8)) {
    _realloc(this,*(SQUnsignedInteger *)(local_18 + 8));
  }
  for (local_28 = 0; local_28 < *(ulong *)(local_18 + 8); local_28 = local_28 + 1) {
    this->_vals[local_28] = *(longlong *)(*(long *)local_18 + local_28 * 8);
  }
  this->_size = *(SQUnsignedInteger *)(local_18 + 8);
  return (int)this;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }